

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O3

void __thiscall StringLiteralNode::~StringLiteralNode(StringLiteralNode *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ExpressionNode).super_Node._vptr_Node =
       (_func_int **)&PTR__StringLiteralNode_001506e0;
  pcVar2 = (this->value_)._M_dataplus._M_p;
  paVar1 = &(this->value_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

StringLiteralNode(const std::string& value): value_(value) {}